

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::StratifiedSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,StratifiedSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  uint64_t uVar9;
  int iVar10;
  undefined4 extraout_var;
  pointer pSVar12;
  long lVar13;
  allocator_type local_29;
  long lVar11;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n == 0) {
    lVar11 = 0;
  }
  else {
    iVar10 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                       (alloc.memoryResource,(long)n * 0x30,8);
    lVar11 = CONCAT44(extraout_var,iVar10);
  }
  if (0 < n) {
    pSVar12 = (__return_storage_ptr__->
              super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      uVar3 = *(undefined8 *)this;
      uVar4 = *(undefined8 *)&this->seed;
      uVar5 = (this->rng).state;
      uVar6 = (this->rng).inc;
      uVar7 = (this->rng).inc;
      TVar8 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
      uVar9 = *(uint64_t *)&this->sampleIndex;
      puVar2 = (uint64_t *)(lVar11 + 0x10 + lVar13);
      *puVar2 = (this->rng).state;
      puVar2[1] = uVar7;
      *(Tuple2<pbrt::Point2,_int> *)(puVar2 + 2) = TVar8;
      puVar2[3] = uVar9;
      puVar1 = (undefined8 *)(lVar11 + lVar13);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      puVar1[2] = uVar5;
      puVar1[3] = uVar6;
      (pSVar12->
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      ).bits = lVar11 + lVar13 | 0x2000000000000;
      lVar13 = lVar13 + 0x30;
      pSVar12 = pSVar12 + 1;
    } while ((ulong)(uint)n * 0x30 != lVar13);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> StratifiedSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    StratifiedSampler *samplerMem =
        (StratifiedSampler *)alloc.allocate_object<StratifiedSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}